

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::NLFeeder_Easy(NLFeeder_Easy *this,NLModel *nls,NLW2_NLOptionsBasic_C opts)

{
  int in_ECX;
  undefined8 in_RDX;
  NLFeeder_Easy *in_RDI;
  NLModel *in_stack_ffffffffffffff88;
  NLFeeder_Easy *this_00;
  
  this_00 = in_RDI;
  NLModel::NLModel(&in_RDI->nlme_,in_stack_ffffffffffffff88);
  (in_RDI->nlopt_).flags_ = in_ECX;
  (in_RDI->nlopt_).n_text_mode_ = (int)in_RDX;
  (in_RDI->nlopt_).want_nl_comments_ = (int)((ulong)in_RDX >> 0x20);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x10bd41);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x10bd57);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x10bd6d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10bd83);
  NLHeader::NLHeader((NLHeader *)this_00);
  Init(this_00);
  return;
}

Assistant:

NLFeeder_Easy(const NLModel& nls, NLW2_NLOptionsBasic_C opts)
    : nlme_(nls), nlopt_(opts) { Init(); }